

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::reallocateTo(SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
               *this,size_type newCapacity)

{
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var1;
  long lVar2;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *__rhs;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *this_00;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  p_Var1 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)operator_new(newCapacity * 0x58);
  if (this->len != 0) {
    __rhs = (EVP_PKEY_CTX *)this->data_;
    lVar2 = this->len * 0x58;
    this_00 = p_Var1;
    do {
      ctx = __rhs;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(this_00,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                 *)__rhs);
      __rhs = __rhs + 0x58;
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x58;
    } while (lVar2 != 0);
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = (pointer)p_Var1;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }